

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::MaterialNode> __thiscall
embree::CoronaLoader::loadMaterial(CoronaLoader *this,Ref<embree::XML> *xml)

{
  pointer pRVar1;
  pointer pRVar2;
  MaterialNode *pMVar3;
  bool bVar4;
  OBJMaterial *pOVar5;
  mapped_type *pmVar6;
  runtime_error *this_00;
  Ref<embree::XML> *in_RDX;
  char *pcVar7;
  XML *pXVar8;
  _Base_ptr this_01;
  CoronaLoader *pCVar9;
  string *this_02;
  pointer pRVar10;
  float fVar11;
  Vec3fa VVar12;
  allocator local_f9;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  string name;
  undefined1 local_a8 [56];
  string local_70;
  string local_50;
  
  bVar4 = std::operator!=(&in_RDX->ptr->name,"material");
  if (bVar4) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ParseLocation::str_abi_cxx11_((string *)local_a8,&in_RDX->ptr->loc);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   ": invalid material: ");
    std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f8,&in_RDX->ptr->name);
    std::runtime_error::runtime_error(this_00,(string *)&name);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pXVar8 = in_RDX->ptr;
  std::__cxx11::string::string((string *)local_f8,"class",(allocator *)local_a8);
  XML::parm(&name,pXVar8,(string *)local_f8);
  bVar4 = std::operator==(&name,"Native");
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)local_f8);
  if (bVar4) {
    pOVar5 = (OBJMaterial *)SceneGraph::MaterialNode::operator_new(0x180);
    std::__cxx11::string::string((string *)&local_50,"",(allocator *)&name);
    local_a8._40_8_ = this;
    OBJMaterial::OBJMaterial(pOVar5,&local_50);
    (*(pOVar5->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pOVar5);
    std::__cxx11::string::~string((string *)&local_50);
    pRVar1 = (in_RDX->ptr->children).
             super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_a8._32_8_ = &pOVar5->_map_d;
    local_a8._48_8_ = &pOVar5->_map_Kd;
    for (pRVar10 = (in_RDX->ptr->children).
                   super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this = (CoronaLoader *)local_a8._40_8_
        , pRVar10 != pRVar1; pRVar10 = pRVar10 + 1) {
      pcVar7 = "diffuse";
      bVar4 = std::operator==(&pRVar10->ptr->name,"diffuse");
      if (bVar4) {
        load<embree::Vec3fa>((CoronaLoader *)&name,(Ref<embree::XML> *)pcVar7);
        *(ulong *)&(pOVar5->Kd).field_0 =
             CONCAT44(name._M_dataplus._M_p._4_4_,name._M_dataplus._M_p._0_4_);
        *(size_type *)((long)&(pOVar5->Kd).field_0 + 8) = name._M_string_length;
        pRVar2 = (pRVar10->ptr->children).
                 super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((pRVar10->ptr->children).
            super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != pRVar2) {
          bVar4 = std::operator==(&pRVar2->ptr->name,"map");
          if (bVar4) {
            loadMap((CoronaLoader *)&name,xml);
            this_01 = (_Base_ptr)local_a8._48_8_;
LAB_00195fff:
            std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)this_01,
                       (__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)&name);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&name._M_string_length);
          }
        }
      }
      else {
        bVar4 = std::operator==(&pRVar10->ptr->name,"reflect");
        if (bVar4) {
          pXVar8 = pRVar10->ptr;
          std::__cxx11::string::string((string *)&name,"color",&local_f9);
          XML::child((XML *)local_a8,(string *)pXVar8);
          VVar12 = load<embree::Vec3fa>((CoronaLoader *)local_f8,(Ref<embree::XML> *)pXVar8);
          (pOVar5->Ks).field_0.m128[0] = (float)local_f8._0_4_;
          (pOVar5->Ks).field_0.m128[1] = (float)local_f8._4_4_;
          (pOVar5->Ks).field_0.m128[2] = fStack_f0;
          (pOVar5->Ks).field_0.m128[3] = fStack_ec;
          if ((_Base_ptr)local_a8._0_8_ != (_Base_ptr)0x0) {
            (**(code **)(*(long *)local_a8._0_8_ + 0x18))(local_f8._0_4_,VVar12.field_0._8_8_);
          }
          std::__cxx11::string::~string((string *)&name);
          pXVar8 = pRVar10->ptr;
          std::__cxx11::string::string((string *)&name,"ior",(allocator *)local_a8);
          pCVar9 = (CoronaLoader *)local_f8;
          XML::child((XML *)local_f8,(string *)pXVar8);
          fVar11 = load<float>(pCVar9,(Ref<embree::XML> *)local_f8);
          pOVar5->Ni = fVar11;
          if ((long *)CONCAT44(local_f8._4_4_,local_f8._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_f8._4_4_,local_f8._0_4_) + 0x18))();
          }
          std::__cxx11::string::~string((string *)&name);
          pXVar8 = pRVar10->ptr;
          std::__cxx11::string::string((string *)&name,"glossiness",(allocator *)local_a8);
          pCVar9 = (CoronaLoader *)local_f8;
          XML::child((XML *)local_f8,(string *)pXVar8);
          fVar11 = load<float>(pCVar9,(Ref<embree::XML> *)local_f8);
          pOVar5->Ns = fVar11;
          if ((long *)CONCAT44(local_f8._4_4_,local_f8._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_f8._4_4_,local_f8._0_4_) + 0x18))();
          }
        }
        else {
          bVar4 = std::operator==(&pRVar10->ptr->name,"translucency");
          if (!bVar4) {
            pcVar7 = "opacity";
            bVar4 = std::operator==(&pRVar10->ptr->name,"opacity");
            if (bVar4) {
              load<embree::Vec3fa>((CoronaLoader *)&name,(Ref<embree::XML> *)pcVar7);
              pOVar5->d = name._M_dataplus._M_p._0_4_;
              pRVar2 = (pRVar10->ptr->children).
                       super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((pRVar10->ptr->children).
                  super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish != pRVar2) {
                bVar4 = std::operator==(&pRVar2->ptr->name,"map");
                if (bVar4) {
                  loadMap((CoronaLoader *)&name,xml);
                  this_01 = (_Base_ptr)local_a8._32_8_;
                  goto LAB_00195fff;
                }
              }
            }
            goto LAB_001961a2;
          }
          pXVar8 = pRVar10->ptr;
          std::__cxx11::string::string((string *)&name,"color",&local_f9);
          XML::child((XML *)local_a8,(string *)pXVar8);
          VVar12 = load<embree::Vec3fa>((CoronaLoader *)local_f8,(Ref<embree::XML> *)pXVar8);
          (pOVar5->Kt).field_0.m128[0] = (float)local_f8._0_4_;
          (pOVar5->Kt).field_0.m128[1] = (float)local_f8._4_4_;
          (pOVar5->Kt).field_0.m128[2] = fStack_f0;
          (pOVar5->Kt).field_0.m128[3] = fStack_ec;
          if ((_Base_ptr)local_a8._0_8_ != (_Base_ptr)0x0) {
            (**(code **)(*(long *)local_a8._0_8_ + 0x18))(local_f8._0_4_,VVar12.field_0._8_8_);
          }
        }
        std::__cxx11::string::~string((string *)&name);
      }
LAB_001961a2:
    }
    (((Node *)local_a8._40_8_)->super_RefCount)._vptr_RefCount = (_func_int **)pOVar5;
    (*(pOVar5->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pOVar5);
    (*(pOVar5->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pOVar5);
  }
  else {
    pXVar8 = in_RDX->ptr;
    std::__cxx11::string::string((string *)local_f8,"class",(allocator *)local_a8);
    XML::parm(&name,pXVar8,(string *)local_f8);
    pcVar7 = "Reference";
    bVar4 = std::operator==(&name,"Reference");
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)local_f8);
    if (bVar4) {
      load<std::__cxx11::string>(&name,(CoronaLoader *)pcVar7,in_RDX);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                             *)(xml + 4),&name);
      pMVar3 = pmVar6->ptr;
      (this->path).filename._M_dataplus._M_p = (pointer)pMVar3;
      if (pMVar3 != (MaterialNode *)0x0) {
        (**(code **)((long)(pMVar3->super_Node).super_RefCount._vptr_RefCount + 0x10))();
      }
      this_02 = &name;
    }
    else {
      pOVar5 = (OBJMaterial *)SceneGraph::MaterialNode::operator_new(0x180);
      std::__cxx11::string::string((string *)&local_70,"",(allocator *)&name);
      OBJMaterial::OBJMaterial(pOVar5,&local_70);
      (this->path).filename._M_dataplus._M_p = (pointer)pOVar5;
      (**(code **)(*(long *)&(pOVar5->super_MaterialNode).super_Node.super_RefCount + 0x10))(pOVar5)
      ;
      this_02 = &local_70;
    }
    std::__cxx11::string::~string((string *)this_02);
  }
  return (Ref<embree::SceneGraph::MaterialNode>)(MaterialNode *)this;
}

Assistant:

Ref<SceneGraph::MaterialNode> CoronaLoader::loadMaterial(const Ref<XML>& xml) 
  {
    if (xml->name != "material") 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid material: "+xml->name);

    /* native material */
    if (xml->parm("class") == "Native") 
    {
      /* we convert into an OBJ material */
      Ref<OBJMaterial> objmaterial = new OBJMaterial;
      for (auto& child : xml->children)
      {
        if (child->name == "diffuse") {
          objmaterial->Kd = load<Vec3fa>(child);
          if (child->children.size() && child->children[0]->name == "map")
            objmaterial->_map_Kd = loadMap(child->children[0]);
        }
        else if (child->name == "reflect") {
          objmaterial->Ks = load<Vec3fa>(child->child("color"));
          objmaterial->Ni = load<float >(child->child("ior"));
          objmaterial->Ns = load<float >(child->child("glossiness"));
        }
        else if (child->name == "translucency") {
          objmaterial->Kt = load<Vec3fa>(child->child("color"));
        }
        else if (child->name == "opacity") {
          objmaterial->d = load<Vec3fa>(child).x;
          if (child->children.size() && child->children[0]->name == "map")
            objmaterial->_map_d = loadMap(child->children[0]);
        }
      }
      return objmaterial.dynamicCast<SceneGraph::MaterialNode>();
    }

    /* reference by name */
    else if (xml->parm("class") == "Reference") 
    {
      const std::string name = load<std::string>(xml);
      return materialMap[name];
    }

    /* else return default material */
    else 
      return new OBJMaterial;
  }